

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Metadata * __thiscall
CoreML::Specification::ModelDescription::mutable_metadata(ModelDescription *this)

{
  Metadata *this_00;
  
  this_00 = this->metadata_;
  if (this_00 == (Metadata *)0x0) {
    this_00 = (Metadata *)operator_new(0x58);
    Metadata::Metadata(this_00);
    this->metadata_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Metadata* ModelDescription::mutable_metadata() {
  
  if (metadata_ == NULL) {
    metadata_ = new ::CoreML::Specification::Metadata;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ModelDescription.metadata)
  return metadata_;
}